

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase309::run(TestCase309 *this)

{
  Builder builder_00;
  Reader reader_00;
  BufferedInputStream *pBVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ReaderOptions options;
  size_t local_2e0;
  TestPipe pipe;
  size_t local_298;
  Builder local_290;
  Reader local_268;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  
  TestMessageBuilder::TestMessageBuilder(&builder,7);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_290,(MessageBuilder *)&builder);
  builder_00._builder.capTable = local_290._builder.capTable;
  builder_00._builder.segment = local_290._builder.segment;
  builder_00._builder.data = local_290._builder.data;
  builder_00._builder.pointers = local_290._builder.pointers;
  builder_00._builder.dataSize = local_290._builder.dataSize;
  builder_00._builder.pointerCount = local_290._builder.pointerCount;
  builder_00._builder._38_2_ = local_290._builder._38_2_;
  initTestMessage(builder_00);
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_0035aef0;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_0035af30;
  pipe.preferredReadSize = 1;
  pipe.data._M_dataplus._M_p = (pointer)&pipe.data.field_2;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  writePackedMessage(&pipe.super_OutputStream,(MessageBuilder *)&builder);
  pBVar1 = (BufferedInputStream *)computeSerializedSizeInWords((MessageBuilder *)&builder);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  reader.super_PackedInputStream.inner =
       (BufferedInputStream *)
       computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  reader.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)anon_var_dwarf_b08b;
  reader.super_InputStreamMessageReader.super_MessageReader.options.traversalLimitInWords = 5;
  reader.super_InputStreamMessageReader.super_MessageReader.options.nestingLimit._0_1_ =
       pBVar1 == reader.super_PackedInputStream.inner;
  reader.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)pBVar1;
  if ((!(bool)(undefined1)
              reader.super_InputStreamMessageReader.super_MessageReader.options.nestingLimit) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2e0 = computeSerializedSizeInWords((MessageBuilder *)&builder);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    local_298 = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::
    log<char_const(&)[106],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x13c,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", _kjCondition, computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(DebugComparison<unsigned_long,_unsigned_long> *)&reader,&local_2e0,&local_298);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_268,&reader.super_InputStreamMessageReader.super_MessageReader);
  reader_00._reader.capTable = local_268._reader.capTable;
  reader_00._reader.segment = local_268._reader.segment;
  reader_00._reader.data = local_268._reader.data;
  reader_00._reader.pointers = local_268._reader.pointers;
  reader_00._reader.dataSize = local_268._reader.dataSize;
  reader_00._reader.pointerCount = local_268._reader.pointerCount;
  reader_00._reader._38_2_ = local_268._reader._38_2_;
  reader_00._reader.nestingLimit = local_268._reader.nestingLimit;
  reader_00._reader._44_4_ = local_268._reader._44_4_;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Packed, RoundTripOddSegmentCountLazy) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}